

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

void RecalculateDrawnSubsectors(void)

{
  long lVar1;
  subsector_t *psVar2;
  long lVar3;
  long lVar4;
  
  psVar2 = subsectors;
  if (0 < numsubsectors) {
    lVar3 = 0;
    do {
      if ((ulong)psVar2[lVar3].numlines != 0) {
        lVar4 = 0;
        do {
          lVar1 = *(long *)((long)&(psVar2[lVar3].firstline)->linedef + lVar4);
          if ((lVar1 != 0) && ((*(byte *)(lVar1 + 0x21) & 1) != 0)) {
            *(byte *)&psVar2[lVar3].flags = (byte)psVar2[lVar3].flags | 2;
          }
          lVar4 = lVar4 + 0x48;
        } while ((ulong)psVar2[lVar3].numlines * 0x48 != lVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < numsubsectors);
  }
  return;
}

Assistant:

void RecalculateDrawnSubsectors()
{
	for(int i=0;i<numsubsectors;i++)
	{
		subsector_t *sub = &subsectors[i];
		for(unsigned int j=0;j<sub->numlines;j++)
		{
			if (sub->firstline[j].linedef != NULL && 
				(sub->firstline[j].linedef->flags & ML_MAPPED))
			{
				sub->flags |= SSECF_DRAWN;
			}
		}
	}
}